

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O1

int __thiscall E64::blitter_ic::terminal_putchar(blitter_ic *this,uint8_t number,int character)

{
  byte bVar1;
  blit_t *pbVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((char)character == '\r') {
    pbVar2 = this->blit;
    uVar5 = (ulong)((uint)number * 0x140);
    *(short *)(pbVar2->command_buffer + (uVar5 - 0xd)) =
         (short)*(uint *)(pbVar2->command_buffer + (uVar5 - 0xd)) -
         (short)((*(uint *)(pbVar2->command_buffer + (uVar5 - 0xd)) & 0xffff) %
                (uint)(byte)pbVar2->command_buffer[uVar5 - 0x41]);
  }
  else if ((character & 0xffU) == 10) {
    pbVar2 = this->blit;
    uVar5 = (ulong)((uint)number * 0x140);
    bVar1 = pbVar2->command_buffer[uVar5 - 0x41];
    uVar4 = *(uint *)(pbVar2->command_buffer + (uVar5 - 0xd)) -
            (*(uint *)(pbVar2->command_buffer + (uVar5 - 0xd)) & 0xffff) % (uint)(ushort)bVar1;
    sVar3 = (short)uVar4;
    *(short *)(pbVar2->command_buffer + (uVar5 - 0xd)) = sVar3;
    if ((uVar4 & 0xffff) / (uint)bVar1 == (byte)pbVar2->command_buffer[uVar5 - 0x3f] - 1) {
      terminal_add_bottom_row(this,number);
    }
    else {
      *(ushort *)(pbVar2->command_buffer + (uVar5 - 0xd)) = (ushort)bVar1 + sVar3;
    }
  }
  else if ((character & 0xffU) == 9) {
    uVar5 = (ulong)((uint)number * 0x140);
    if (((ulong)*(ushort *)(this->blit->command_buffer + (uVar5 - 0xd)) %
         (ulong)(byte)this->blit->command_buffer[uVar5 - 0x41] & 3) != 0) {
      uVar5 = (ulong)((uint)number * 0x140);
      do {
        terminal_putsymbol(this,number,' ');
      } while (((ulong)*(ushort *)(this->blit->command_buffer + (uVar5 - 0xd)) %
                (ulong)(byte)this->blit->command_buffer[uVar5 - 0x41] & 3) != 0);
    }
  }
  else {
    terminal_putsymbol(this,number,(char)character);
  }
  return character & 0xff;
}

Assistant:

int E64::blitter_ic::terminal_putchar(uint8_t number, int character)
{
	uint8_t result = (uint8_t)character;
	switch (result) {
		case '\r':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			break;
		case '\n':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			if ((blit[number].cursor_position / blit[number].get_columns()) == (blit[number].get_rows() - 1)) {
				terminal_add_bottom_row(number);
			} else {
				blit[number].cursor_position += blit[number].get_columns();
			}
			break;
		case '\t':
			while ((blit[number].cursor_position % blit[number].get_columns()) & 0b11) {
				terminal_putsymbol(number, ' ');
			}
			break;
		default:
			terminal_putsymbol(number, result);
			break;
	}
	return result;
}